

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O3

void capnp::_::PointerHelpers<capnp::List<unsigned_char,_(capnp::Kind)0>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_unsigned_char> value)

{
  ulong uVar1;
  ListBuilder local_50;
  PointerBuilder local_28;
  
  local_28.pointer = builder.pointer;
  local_28.segment = builder.segment;
  local_28.capTable = builder.capTable;
  PointerBuilder::initList(&local_50,&local_28,BYTE,(ElementCount)value.size_);
  if (value.size_ != 0) {
    uVar1 = 0;
    do {
      local_50.ptr[(uVar1 & 0xffffffff) * (ulong)local_50.step >> 3] = value.ptr[uVar1];
      uVar1 = uVar1 + 1;
    } while (value.size_ != uVar1);
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }